

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

void Abc_NtkSupportSum(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  uint uVar1;
  int i;
  Abc_Obj_t *pObj;
  
  uVar1 = 0;
  for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
    pObj = Abc_NtkCo(pNtk,i);
    p = Abc_NtkNodeSupport(pNtk,&pObj,1);
    uVar1 = uVar1 + p->nSize;
    Vec_PtrFree(p);
  }
  printf("Total supports = %d.\n",(ulong)uVar1);
  return;
}

Assistant:

void Abc_NtkSupportSum( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    int i, nTotalSupps = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        nTotalSupps += Vec_PtrSize( vSupp );
        Vec_PtrFree( vSupp );
    }
    printf( "Total supports = %d.\n", nTotalSupps );
}